

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> __thiscall
Catch::createReporter(Catch *this,string *reporterName,Ptr<Catch::Config> *config)

{
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  long *plVar3;
  ostream *poVar4;
  domain_error *this_00;
  Ptr<const_Catch::IConfig> local_1c0;
  ostringstream oss;
  string local_48 [32];
  
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[2])(pIVar2);
  local_1c0.m_p = (IConfig *)config->m_p;
  if ((Config *)local_1c0.m_p != (Config *)0x0) {
    (*(((Config *)local_1c0.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar1),reporterName,&local_1c0);
  *(long **)this = plVar3;
  if (plVar3 == (long *)0x0) {
    Ptr<const_Catch::IConfig>::~Ptr(&local_1c0);
  }
  else {
    (**(code **)(*plVar3 + 0x10))(plVar3);
    Ptr<const_Catch::IConfig>::~Ptr(&local_1c0);
    if (plVar3 != (long *)0x0) {
      return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
  poVar4 = std::operator<<((ostream *)&local_1c0,"No reporter registered with name: \'");
  poVar4 = std::operator<<(poVar4,(string *)reporterName);
  std::operator<<(poVar4,"\'");
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_48);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

Ptr<IStreamingReporter> createReporter(std::string const& reporterName, Ptr<Config> const& config) {
		Ptr<IStreamingReporter> reporter = getRegistryHub().getReporterRegistry().create(reporterName, config.get());
		if (!reporter) {
			std::ostringstream oss;
			oss << "No reporter registered with name: '" << reporterName << "'";
			throw std::domain_error(oss.str());
		}
		return reporter;
	}